

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

bool __thiscall JFSON::Json::has_shape(Json *this,shape *types,string *err)

{
  bool bVar1;
  Type TVar2;
  Json *this_00;
  Json local_118 [2];
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  const_iterator local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json::Type>
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  shape *__range1;
  Json local_68 [2];
  string local_48 [32];
  string *local_28;
  string *err_local;
  shape *types_local;
  Json *this_local;
  
  local_28 = err;
  err_local = (string *)types;
  types_local = (shape *)this;
  bVar1 = is_object(this);
  if (bVar1) {
    __begin1 = (const_iterator)err_local;
    __end1 = std::
             initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json::Type>_>
             ::begin((initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json::Type>_>
                      *)err_local);
    item = std::
           initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json::Type>_>
           ::end((initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json::Type>_>
                  *)__begin1);
    for (; __end1 != item; __end1 = __end1 + 1) {
      local_98 = __end1;
      this_00 = operator[](this,&__end1->first);
      TVar2 = type(this_00);
      if (TVar2 != local_98->second) {
        std::operator+((char *)local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "bad type for ");
        std::operator+(local_d8,(char *)local_f8);
        dump_abi_cxx11_(local_118);
        std::operator+(local_b8,local_d8);
        std::__cxx11::string::operator=((string *)local_28,(string *)local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)local_118);
        std::__cxx11::string::~string((string *)local_d8);
        std::__cxx11::string::~string(local_f8);
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    dump_abi_cxx11_(local_68);
    std::operator+((char *)local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "expected JSON object, got ");
    std::__cxx11::string::operator=((string *)local_28,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)local_68);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Json::has_shape(const shape & types, string & err) const {
    if (!is_object()) {
        err = "expected JSON object, got " + dump();
        return false;
    }

    for (auto & item : types) {
        if ((*this)[item.first].type() != item.second) {
            err = "bad type for " + item.first + " in " + dump();
            return false;
        }
    }

    return true;
}